

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOReadFmsDataCollection
              (FmsIOContext *ctx,FmsIOFunctions *io,char *key,
              FmsIODataCollectionInfo *data_collection)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  void *pvVar5;
  FmsIOFieldInfo *field_info;
  long *in_RCX;
  FmsIOFunctions *in_RDX;
  FmsIOContext *in_RSI;
  long in_RDI;
  char *kmd;
  char *kmesh;
  char *kfi;
  char tmp_1 [20];
  char *kfs;
  char *knfs;
  char *kfdi;
  char tmp [20];
  char *kfds;
  char *knfds;
  char *kname;
  FmsInt i;
  int err;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *k1;
  char local_98 [24];
  FmsIOFunctions *in_stack_ffffffffffffff90;
  FmsIOContext *in_stack_ffffffffffffff98;
  FmsIOFunctions *in_stack_ffffffffffffffa0;
  FmsIOContext *in_stack_ffffffffffffffa8;
  ulong local_38;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar6;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI == (FmsIOContext *)0x0) {
    local_4 = 2;
  }
  else if (in_RDX == (FmsIOFunctions *)0x0) {
    local_4 = 3;
  }
  else if (in_RCX == (long *)0x0) {
    local_4 = 4;
  }
  else {
    *in_RCX = 0;
    pcVar4 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    iVar1 = (*(code *)in_RSI[3].temp_strings)(in_RDI,pcVar4,in_RCX);
    if (pcVar4 != (char *)0x0) {
      free(pcVar4);
    }
    if (iVar1 == 0) {
      if (*in_RCX == 0) {
        local_4 = 7;
      }
      else {
        in_RCX[1] = 0;
        in_RCX[2] = 0;
        pcVar4 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        iVar1 = (*(code *)in_RSI[2].temp_strings_cap)(in_RDI,pcVar4,in_RCX + 1);
        if (pcVar4 != (char *)0x0) {
          free(pcVar4);
        }
        if (iVar1 == 0) {
          if (in_RCX[1] != 0) {
            pcVar4 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            pvVar5 = calloc(0x28,in_RCX[1]);
            in_RCX[2] = (long)pvVar5;
            uVar6 = 0;
            for (local_38 = 0; local_38 < (ulong)in_RCX[1]; local_38 = local_38 + 1) {
              sprintf(&stack0xffffffffffffff98,"%d",local_38 & 0xffffffff);
              in_stack_ffffffffffffff90 =
                   (FmsIOFunctions *)join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
              uVar2 = FmsIOReadFmsFieldDescriptor
                                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                 (char *)in_stack_ffffffffffffff98,
                                 (FmsIOFieldDescriptorInfo *)in_stack_ffffffffffffff90);
              uVar6 = uVar2 | uVar6;
              if (in_stack_ffffffffffffff90 != (FmsIOFunctions *)0x0) {
                free(in_stack_ffffffffffffff90);
              }
            }
            if (pcVar4 != (char *)0x0) {
              free(pcVar4);
            }
            if (uVar6 != 0) {
              return 0xb;
            }
          }
          in_RCX[3] = 0;
          in_RCX[4] = 0;
          pcVar4 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          iVar1 = (*(code *)in_RSI[2].temp_strings_cap)(in_RDI,pcVar4,in_RCX + 3);
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          if (iVar1 == 0) {
            if (in_RCX[3] != 0) {
              field_info = (FmsIOFieldInfo *)
                           join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
              pvVar5 = calloc(0x40,in_RCX[3]);
              in_RCX[4] = (long)pvVar5;
              uVar6 = 0;
              for (local_38 = 0; local_38 < (ulong)in_RCX[3]; local_38 = local_38 + 1) {
                k1 = (char *)0x0;
                sprintf(local_98,"%d",local_38 & 0xffffffff);
                in_stack_ffffffffffffff60 = join_keys(k1,in_stack_ffffffffffffff58);
                uVar2 = FmsIOReadFmsField(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,pcVar4
                                          ,field_info);
                uVar6 = uVar2 | uVar6;
                if (in_stack_ffffffffffffff60 != (char *)0x0) {
                  free(in_stack_ffffffffffffff60);
                }
              }
              if (field_info != (FmsIOFieldInfo *)0x0) {
                free(field_info);
              }
              if (uVar6 != 0) {
                return 0xd;
              }
            }
            in_RCX[5] = 0;
            pcVar4 = join_keys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            pvVar5 = calloc(0x38,1);
            in_RCX[5] = (long)pvVar5;
            iVar1 = FmsIOReadFmsMesh((FmsIOContext *)tmp_1._8_8_,(FmsIOFunctions *)tmp_1._0_8_,kfi,
                                     (FmsIOMeshInfo *)kmesh);
            if (pcVar4 != (char *)0x0) {
              free(pcVar4);
            }
            if (iVar1 == 0) {
              in_RCX[6] = 0;
              pcVar4 = join_keys(in_stack_ffffffffffffff60,pcVar4);
              iVar3 = (*(code *)in_RSI[2].temp_strings_size)(in_RDI,pcVar4);
              if (iVar3 != 0) {
                pvVar5 = calloc(0x20,1);
                in_RCX[6] = (long)pvVar5;
                if (in_RCX[6] != 0) {
                  iVar1 = FmsIOReadFmsMetaData
                                    (in_RSI,in_RDX,(char *)in_RCX,
                                     (FmsIOMetaDataInfo *)CONCAT44(iVar1,in_stack_ffffffffffffffd0))
                  ;
                }
              }
              if (pcVar4 != (char *)0x0) {
                free(pcVar4);
              }
              if (iVar1 == 0) {
                local_4 = 0;
              }
              else {
                local_4 = 0xf;
              }
            }
            else {
              local_4 = 0xe;
            }
          }
          else {
            local_4 = 0xc;
          }
        }
        else {
          local_4 = 8;
        }
      }
    }
    else {
      local_4 = 6;
    }
  }
  return local_4;
}

Assistant:

static int
FmsIOReadFmsDataCollection(FmsIOContext *ctx, FmsIOFunctions *io,
                           const char *key,
                           FmsIODataCollectionInfo *data_collection) {
  if(!ctx) E_RETURN(1);
  if(!io) E_RETURN(2);
  if(!key) E_RETURN(3);
  if(!data_collection) E_RETURN(4);
  int err = 0;
  FmsInt i = 0;

  // Process DataCollection's Name
  data_collection->name = NULL;
  {
    char *kname = join_keys(key, "Name");
    err = (*io->get_string)(ctx, kname, &data_collection->name);
    FREE(kname);
    if(err)
      E_RETURN(6);
  }

  if(!data_collection->name)
    E_RETURN(7);

  // Process FieldDescriptors
  data_collection->nfds = 0;
  data_collection->fds = NULL;
  {
    char *knfds = join_keys(key, "NumberOfFieldDescriptors");
    err = (*io->get_int)(ctx, knfds, &data_collection->nfds);
    FREE(knfds);
    if(err)
      E_RETURN(8);

    // Make sure there were actually any FieldDescriptors
    if(data_collection->nfds) {
      char *kfds = join_keys(key, "FieldDescriptors");
      data_collection->fds = calloc(sizeof(FmsIOFieldDescriptorInfo),
                                    data_collection->nfds);
      err = 0;
      for(i = 0; i < data_collection->nfds; i++) {
        char tmp[20], *kfdi = NULL;
        sprintf(tmp, "%d", (int)i);
        kfdi = join_keys(kfds, tmp);
        err |= FmsIOReadFmsFieldDescriptor(ctx, io, kfdi, &data_collection->fds[i]);
        FREE(kfdi);
      }
      FREE(kfds);
      if(err)
        E_RETURN(11);
    }
  }

  // Process Fields
  data_collection->nfields = 0;
  data_collection->fields = NULL;
  {
    char *knfs = join_keys(key, "NumberOfFields");
    err = (*io->get_int)(ctx, knfs, &data_collection->nfields);
    FREE(knfs);
    if(err)
      E_RETURN(12);

    // Make sure there were actually any Fields
    if(data_collection->nfields) {
      char *kfs = join_keys(key, "Fields");
      data_collection->fields = calloc(sizeof(FmsIOFieldInfo),
                                       data_collection->nfields);
      err = 0;
      for(i = 0; i < data_collection->nfields; i++) {
        char tmp[20], *kfi = NULL;
        sprintf(tmp, "%d", (int)i);
        kfi = join_keys(kfs, tmp);
        err |= FmsIOReadFmsField(ctx, io, kfi, &data_collection->fields[i]);
        FREE(kfi);
      }
      FREE(kfs);
      if(err)
        E_RETURN(13);
    }
  }

  // Process mesh
  data_collection->mesh_info = NULL;
  {
    char *kmesh = join_keys(key, "Mesh");
    data_collection->mesh_info = calloc(sizeof(FmsIOMeshInfo), 1);
    err = FmsIOReadFmsMesh(ctx, io, kmesh, data_collection->mesh_info);
    FREE(kmesh);
    if(err)
      E_RETURN(14);
  }


  // Process MetaData (if we have it)
  data_collection->md = NULL;
  {
    char *kmd = join_keys(key, "MetaData");
    if((*io->has_path)(ctx, kmd)) {
      data_collection->md = calloc(sizeof(FmsIOMetaDataInfo), 1);
      if(data_collection->md)
        err = FmsIOReadFmsMetaData(ctx, io, kmd, data_collection->md);
    }
    FREE(kmd);
    if(err)
      E_RETURN(15);
  }

  return 0;
}